

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

void __thiscall
FlowGraph::WalkLoopBlocks(FlowGraph *this,BasicBlock *block,Loop *loop,JitArenaAllocator *tempAlloc)

{
  uint uVar1;
  JitArenaAllocator *pJVar2;
  BasicBlock *pBVar3;
  code *pcVar4;
  bool bVar5;
  BOOLEAN BVar6;
  bool bVar7;
  ImplicitCallFlags newFlags;
  BasicBlock *block_1;
  undefined4 *puVar8;
  Loop *this_00;
  BasicBlock *block_00;
  Type *ppFVar9;
  BasicBlock *pBVar10;
  Loop *pLVar11;
  Loop *pLVar12;
  char *this_01;
  char cVar13;
  undefined1 local_48 [8];
  Iterator __iter;
  
  if (loop == (Loop *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x553,"(loop)","loop");
    if (!bVar5) {
LAB_0041c662:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar8 = 0;
  }
  this_00 = (Loop *)new<Memory::JitArenaAllocator>(0x20,tempAlloc,0x3f1274);
  this_00->implicitCallFlags = ImplicitCall_HasNoInfo;
  this_00->loopFlags = (LoopFlags)0x0;
  *(undefined6 *)&this_00->field_0x2 = 0;
  this_00->headBlock = (BasicBlock *)0x0;
  this_00->topFunc = (Func *)tempAlloc;
  *(Loop **)&this_00->loopNumber = this_00;
  pLVar12 = this_00;
  BVSparse<Memory::JitArenaAllocator>::Set
            ((BVSparse<Memory::JitArenaAllocator> *)this_00,block->number);
  AddBlockToLoop((FlowGraph *)pLVar12,block,loop);
  if (loop->headBlock == block) {
    return;
  }
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  __iter.current._7_1_ = loop != (Loop *)0x0;
  block_00 = block;
LAB_0041c327:
  this_01 = (char *)this_00;
  BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                    ((BVSparse<Memory::JitArenaAllocator> *)this_00,block_00->number);
  local_48 = (undefined1  [8])&block_00->succList;
  bVar5 = BVar6 == '\0';
  __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48;
  do {
    pLVar12 = loop;
    if (bVar5) {
      pLVar12 = (Loop *)0x0;
    }
    while( true ) {
      do {
        if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          this_01 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
          ;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                             ,0x76,"(current != nullptr)","current != nullptr");
          if (!bVar7) goto LAB_0041c662;
          *puVar8 = 0;
        }
        __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
                      ((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
        if ((undefined1  [8])__iter.list == local_48) {
          pBVar10 = block_00;
          __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
          if (bVar5) goto LAB_0041c63e;
          local_48 = (undefined1  [8])&block_00->predList;
          __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)local_48;
          goto LAB_0041c489;
        }
        this_01 = (char *)local_48;
        ppFVar9 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                            ((Iterator *)local_48);
        pBVar10 = (*ppFVar9)->succBlock;
        if (pBVar10 == (BasicBlock *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar8 = 1;
          this_01 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
          ;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                             ,0x566,"(succ)","succ");
          if (!bVar7) goto LAB_0041c662;
          *puVar8 = 0;
        }
      } while ((pBVar10->field_0x18 & 4) == 0);
      if (loop->headBlock == pBVar10) break;
      if ((pBVar10->loop == (Loop *)0x0) || (pBVar10->loop->headBlock != pBVar10)) {
        this_01 = (char *)this;
        BuildLoop(this,pBVar10,block_00,pLVar12);
      }
    }
    bVar5 = false;
  } while( true );
LAB_0041c489:
  if (__iter.list == (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    this_01 = 
    "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
    ;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                       ,0x76,"(current != nullptr)","current != nullptr");
    if (!bVar5) goto LAB_0041c662;
    *puVar8 = 0;
  }
  pJVar2 = (JitArenaAllocator *)((__iter.list)->super_SListNodeBase<Memory::ArenaAllocator>).next;
  __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)0x0;
  if ((undefined1  [8])pJVar2 == local_48) goto LAB_0041c5e9;
  __iter.list = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)pJVar2;
  ppFVar9 = SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Iterator::Data
                      ((Iterator *)local_48);
  pBVar3 = (*ppFVar9)->predBlock;
  if (pBVar3 == (BasicBlock *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar8 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x57a,"(pred)","pred");
    if (!bVar5) goto LAB_0041c662;
    *puVar8 = 0;
  }
  pLVar12 = pBVar3->loop;
  if (((pLVar12 != loop && pLVar12 != (Loop *)0x0) &&
      (uVar1 = loop->headBlock->number, uVar1 < pLVar12->headBlock->number)) &&
     ((pLVar12->parent == (Loop *)0x0 || (pLVar12->parent->headBlock->number < uVar1)))) {
    pLVar12->parent = loop;
    loop->field_0x179 = loop->field_0x179 & 0xfe;
    if ((pBVar3->loop->field_0x178 & 8) != 0) {
      Loop::SetHasCall(loop);
    }
    if ((pBVar3->loop->field_0x178 & 0x10) != 0) {
      Loop::SetHasYield(loop);
    }
    newFlags = Loop::GetImplicitCallFlags(pBVar3->loop);
    Loop::SetImplicitCallFlags(loop,newFlags);
  }
  this_01 = (char *)this_00;
  BVSparse<Memory::JitArenaAllocator>::Set
            ((BVSparse<Memory::JitArenaAllocator> *)this_00,pBVar3->number);
  goto LAB_0041c489;
LAB_0041c5e9:
  pLVar12 = block_00->loop;
  if (pLVar12 != (Loop *)0x0) {
    cVar13 = __iter.current._7_1_;
    if ((loop != (Loop *)0x0) && (pLVar11 = loop, pLVar12 != loop)) {
      do {
        pLVar11 = pLVar11->parent;
        cVar13 = pLVar11 != (Loop *)0x0;
        if (pLVar11 == pLVar12) break;
      } while (pLVar11 != (Loop *)0x0);
    }
    if (cVar13 == '\0') goto LAB_0041c629;
  }
  block_00->loop = loop;
LAB_0041c629:
  if (block_00 != block) {
    AddBlockToLoop((FlowGraph *)this_01,block_00,loop);
  }
LAB_0041c63e:
  do {
    pBVar10 = pBVar10->prev;
  } while ((pBVar10->field_0x18 & 1) != 0);
  bVar5 = block_00 == loop->headBlock;
  block_00 = pBVar10;
  if (bVar5) {
    return;
  }
  goto LAB_0041c327;
}

Assistant:

void
FlowGraph::WalkLoopBlocks(BasicBlock *block, Loop *loop, JitArenaAllocator *tempAlloc)
{
    AnalysisAssert(loop);

    BVSparse<JitArenaAllocator> *loopBlocksBv = JitAnew(tempAlloc, BVSparse<JitArenaAllocator>, tempAlloc);
    BasicBlock *tailBlock = block;
    BasicBlock *lastBlock;
    loopBlocksBv->Set(block->GetBlockNum());

    this->AddBlockToLoop(block, loop);

    if (block == loop->headBlock)
    {
        // Single block loop, we're done
        return;
    }

    do
    {
        BOOL isInLoop = loopBlocksBv->Test(block->GetBlockNum());

        FOREACH_SUCCESSOR_BLOCK(succ, block)
        {
            if (succ->isLoopHeader)
            {
                // Found a loop back-edge
                if (loop->headBlock == succ)
                {
                    isInLoop = true;
                }
                else if (succ->loop == nullptr || succ->loop->headBlock != succ)
                {
                    // Recurse on inner loop
                    BuildLoop(succ, block, isInLoop ? loop : nullptr);
                }
            }
        } NEXT_SUCCESSOR_BLOCK;

        if (isInLoop)
        {
            // This block is in the loop.  All of it's predecessors should be contained in the loop as well.
            FOREACH_PREDECESSOR_BLOCK(pred, block)
            {
                // Fix up loop parent if it isn't set already.
                // If pred->loop != loop, we're looking at an inner loop, which was already visited.
                // If pred->loop->parent == nullptr, this is the first time we see this loop from an outer
                // loop, so this must be an immediate child.
                if (pred->loop && pred->loop != loop && loop->headBlock->number < pred->loop->headBlock->number
                    && (pred->loop->parent == nullptr || pred->loop->parent->headBlock->number < loop->headBlock->number))
                {
                    pred->loop->parent = loop;
                    loop->isLeaf = false;
                    if (pred->loop->hasCall)
                    {
                        loop->SetHasCall();
                    }
                    if (pred->loop->hasYield)
                    {
                        loop->SetHasYield();
                    }
                    loop->SetImplicitCallFlags(pred->loop->GetImplicitCallFlags());
                }
                // Add pred to loop bit vector
                loopBlocksBv->Set(pred->GetBlockNum());
            } NEXT_PREDECESSOR_BLOCK;

            if (block->loop == nullptr || block->loop->IsDescendentOrSelf(loop))
            {
                block->loop = loop;
            }

            if (block != tailBlock)
            {
                this->AddBlockToLoop(block, loop);
            }
        }
        lastBlock = block;
        block = block->GetPrev();
    } while (lastBlock != loop->headBlock);
}